

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O1

void secp256k1_ecmult_gen(secp256k1_ecmult_gen_context *ctx,secp256k1_gej *r,secp256k1_scalar *gn)

{
  secp256k1_ge_storage (*paasVar1) [64] [16];
  long lVar2;
  ulong uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  secp256k1_gej *psVar7;
  uint32_t uVar8;
  secp256k1_gej *psVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  secp256k1_ge add;
  secp256k1_scalar gnb;
  uint32_t local_140;
  uint32_t local_13c;
  uint32_t local_138;
  uint32_t local_134;
  secp256k1_ge_storage local_118;
  secp256k1_ecmult_gen_context *local_d8;
  secp256k1_gej *local_d0;
  ulong local_c8;
  long local_c0;
  secp256k1_ge local_b8;
  secp256k1_scalar local_58;
  
  local_118.x.n[0] = 0;
  local_118.x.n[1] = 0;
  local_118.x.n[2] = 0;
  local_118.x.n[3] = 0;
  local_118.x.n[4] = 0;
  local_118.x.n[5] = 0;
  local_118.x.n[6] = 0;
  local_118.x.n[7] = 0;
  local_118.y.n[0] = 0;
  local_118.y.n[1] = 0;
  local_118.y.n[2] = 0;
  local_118.y.n[3] = 0;
  local_118.y.n[4] = 0;
  local_118.y.n[5] = 0;
  local_118.y.n[6] = 0;
  local_118.y.n[7] = 0;
  psVar7 = &ctx->initial;
  psVar9 = r;
  for (lVar2 = 0x1f; lVar2 != 0; lVar2 = lVar2 + -1) {
    (psVar9->x).n[0] = (psVar7->x).n[0];
    psVar7 = (secp256k1_gej *)((psVar7->x).n + 1);
    psVar9 = (secp256k1_gej *)((psVar9->x).n + 1);
  }
  local_d8 = ctx;
  local_d0 = r;
  secp256k1_scalar_add(&local_58,gn,&ctx->blind);
  local_b8.infinity = 0;
  local_134 = local_118.x.n[6];
  local_138 = local_118.x.n[7];
  local_13c = local_118.y.n[0];
  local_140 = local_118.y.n[1];
  local_c0 = 0x3c;
  local_c8 = 0;
  uVar6 = local_118.x.n[0];
  uVar8 = local_118.x.n[1];
  uVar10 = local_118.x.n[2];
  uVar11 = local_118.x.n[3];
  uVar12 = local_118.x.n[4];
  uVar13 = local_118.x.n[5];
  uVar14 = local_118.y.n[2];
  uVar4 = local_118.y.n[3];
  uVar5 = local_118.y.n[4];
  uVar15 = local_118.y.n[5];
  uVar17 = local_118.y.n[6];
  uVar16 = local_118.y.n[7];
  do {
    paasVar1 = local_d8->prec;
    uVar3 = 0;
    do {
      if ((local_58.d[local_c8 >> 3 & 0x1fffffff] >> ((char)local_c8 * '\x04' & 0x1fU) & 0xf) << 6
          == uVar3) {
        uVar6 = *(uint32_t *)((long)paasVar1[-1][0x3f][0xf].x.n + uVar3 + local_c0 + 4);
        uVar8 = *(uint32_t *)((long)paasVar1[-1][0x3f][0xf].x.n + uVar3 + local_c0 + 8);
        uVar10 = *(uint32_t *)((long)paasVar1[-1][0x3f][0xf].x.n + uVar3 + local_c0 + 0xc);
        uVar11 = *(uint32_t *)((long)paasVar1[-1][0x3f][0xf].x.n + uVar3 + local_c0 + 0x10);
        uVar12 = *(uint32_t *)((long)paasVar1[-1][0x3f][0xf].x.n + uVar3 + local_c0 + 0x14);
        uVar13 = *(uint32_t *)((long)paasVar1[-1][0x3f][0xf].x.n + uVar3 + local_c0 + 0x18);
        local_134 = *(uint32_t *)((long)paasVar1[-1][0x3f][0xf].x.n + uVar3 + local_c0 + 0x1c);
        local_138 = *(uint32_t *)((long)paasVar1[-1][0x3f][0xf].y.n + uVar3 + local_c0);
        local_13c = *(uint32_t *)((long)paasVar1[-1][0x3f][0xf].y.n + uVar3 + local_c0 + 4);
        local_140 = *(uint32_t *)((long)paasVar1[-1][0x3f][0xf].y.n + uVar3 + local_c0 + 8);
        uVar14 = *(uint32_t *)((long)paasVar1[-1][0x3f][0xf].y.n + uVar3 + local_c0 + 0xc);
        uVar4 = *(uint32_t *)((long)paasVar1[-1][0x3f][0xf].y.n + uVar3 + local_c0 + 0x10);
        uVar5 = *(uint32_t *)((long)paasVar1[-1][0x3f][0xf].y.n + uVar3 + local_c0 + 0x14);
        uVar15 = *(uint32_t *)((long)paasVar1[-1][0x3f][0xf].y.n + uVar3 + local_c0 + 0x18);
        uVar17 = *(uint32_t *)((long)paasVar1[-1][0x3f][0xf].y.n + uVar3 + local_c0 + 0x1c);
        uVar16 = *(uint32_t *)((long)(*paasVar1)[0][0].x.n + uVar3 + local_c0);
      }
      uVar3 = uVar3 + 0x40;
    } while (uVar3 != 0x400);
    local_118.x.n[1] = uVar8;
    local_118.x.n[0] = uVar6;
    local_118.x.n[3] = uVar11;
    local_118.x.n[2] = uVar10;
    local_118.x.n[5] = uVar13;
    local_118.x.n[4] = uVar12;
    local_118.x.n[7] = local_138;
    local_118.x.n[6] = local_134;
    local_118.y.n[1] = local_140;
    local_118.y.n[0] = local_13c;
    local_118.y.n[3] = uVar4;
    local_118.y.n[2] = uVar14;
    local_118.y.n[5] = uVar15;
    local_118.y.n[4] = uVar5;
    local_118.y.n[7] = uVar16;
    local_118.y.n[6] = uVar17;
    secp256k1_ge_from_storage(&local_b8,&local_118);
    secp256k1_gej_add_ge(local_d0,local_d0,&local_b8);
    local_c8 = local_c8 + 1;
    local_c0 = local_c0 + 0x400;
  } while (local_c8 != 0x40);
  return;
}

Assistant:

static void secp256k1_ecmult_gen(const secp256k1_ecmult_gen_context *ctx, secp256k1_gej *r, const secp256k1_scalar *gn) {
    secp256k1_ge add;
    secp256k1_ge_storage adds;
    secp256k1_scalar gnb;
    int bits;
    int i, j;
    memset(&adds, 0, sizeof(adds));
    *r = ctx->initial;
    /* Blind scalar/point multiplication by computing (n-b)G + bG instead of nG. */
    secp256k1_scalar_add(&gnb, gn, &ctx->blind);
    add.infinity = 0;
    for (j = 0; j < 64; j++) {
        bits = secp256k1_scalar_get_bits(&gnb, j * 4, 4);
        for (i = 0; i < 16; i++) {
            /** This uses a conditional move to avoid any secret data in array indexes.
             *   _Any_ use of secret indexes has been demonstrated to result in timing
             *   sidechannels, even when the cache-line access patterns are uniform.
             *  See also:
             *   "A word of warning", CHES 2013 Rump Session, by Daniel J. Bernstein and Peter Schwabe
             *    (https://cryptojedi.org/peter/data/chesrump-20130822.pdf) and
             *   "Cache Attacks and Countermeasures: the Case of AES", RSA 2006,
             *    by Dag Arne Osvik, Adi Shamir, and Eran Tromer
             *    (http://www.tau.ac.il/~tromer/papers/cache.pdf)
             */
            secp256k1_ge_storage_cmov(&adds, &(*ctx->prec)[j][i], i == bits);
        }
        secp256k1_ge_from_storage(&add, &adds);
        secp256k1_gej_add_ge(r, r, &add);
    }
    bits = 0;
    secp256k1_ge_clear(&add);
    secp256k1_scalar_clear(&gnb);
}